

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_movep_re(m68k_info *info,int size)

{
  uint uVar1;
  cs_m68k *pcVar2;
  
  pcVar2 = build_init_op(info,0x11d,2,size);
  pcVar2->operands[0].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_D0;
  pcVar2->operands[1].type = M68K_OP_MEM;
  pcVar2->operands[1].address_mode = M68K_AM_REGI_ADDR_DISP;
  pcVar2->operands[1].mem.base_reg = (info->ir & 7) + M68K_REG_A0;
  uVar1 = read_imm_16(info);
  pcVar2->operands[1].mem.disp = (int16_t)uVar1;
  return;
}

Assistant:

static void build_movep_re(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVEP, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);

	op1->address_mode = M68K_AM_REGI_ADDR_DISP;
	op1->type = M68K_OP_MEM;
	op1->mem.base_reg = M68K_REG_A0 + (info->ir & 7);
	op1->mem.disp = (int16_t)read_imm_16(info);
}